

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  uint uVar2;
  undefined4 uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  __m256i alVar9;
  __m256i alVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  parasail_result_t *ppVar14;
  __m256i *ptr;
  __m256i *palVar15;
  __m256i *ptr_00;
  int64_t *ptr_01;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  __m256i *palVar23;
  long lVar24;
  ulong uVar25;
  __m256i *palVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  undefined8 uVar33;
  int iVar34;
  uint uVar35;
  ulong size;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  int local_c4;
  undefined1 auVar38 [32];
  
  auVar52 = in_ZMM12._0_16_;
  auVar50 = in_ZMM11._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_table_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_striped_profile_avx2_256_64_cold_1();
        }
        else {
          uVar27 = uVar2 - 1;
          uVar29 = (ulong)uVar2 + 3;
          size = uVar29 >> 2;
          uVar7 = (ulong)uVar27 % size;
          iVar12 = (int)(uVar27 / size);
          uVar21 = CONCAT44(0,open);
          iVar31 = -open;
          iVar34 = ppVar5->min;
          uVar16 = 0x8000000000000000 - (long)iVar34;
          if (iVar34 != iVar31 && SBORROW4(iVar34,iVar31) == iVar34 + open < 0) {
            uVar16 = uVar21 | 0x8000000000000000;
          }
          iVar34 = ppVar5->max;
          ppVar14 = parasail_result_new_table1((uint)uVar29 & 0x7ffffffc,s2Len);
          if (ppVar14 != (parasail_result_t *)0x0) {
            ppVar14->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar14->flag | 0x4820802;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar15 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar15 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar1 = s2Len + -1;
              iVar28 = -iVar12 + 3;
              auVar44._8_4_ = open;
              auVar44._0_8_ = uVar21;
              auVar44._12_4_ = 0;
              auVar44._16_4_ = open;
              auVar44._20_4_ = 0;
              auVar44._24_4_ = open;
              auVar44._28_4_ = 0;
              auVar45._8_4_ = gap;
              auVar45._0_8_ = CONCAT44(0,gap);
              auVar45._12_4_ = 0;
              auVar45._16_4_ = gap;
              auVar45._20_4_ = 0;
              auVar45._24_4_ = gap;
              auVar45._28_4_ = 0;
              lVar22 = uVar16 + 1;
              lVar24 = 0x7ffffffffffffffe - (long)iVar34;
              auVar37._8_8_ = lVar22;
              auVar37._0_8_ = lVar22;
              auVar38._16_8_ = lVar22;
              auVar38._0_16_ = auVar37;
              auVar38._24_8_ = lVar22;
              auVar39._8_8_ = lVar24;
              auVar39._0_8_ = lVar24;
              auVar39._16_8_ = lVar24;
              auVar39._24_8_ = lVar24;
              bVar36 = s1_beg != 0;
              uVar25 = (ulong)iVar31;
              uVar35 = (uint)size;
              auVar48._4_4_ = uVar35;
              auVar48._0_4_ = uVar35;
              auVar48._8_4_ = uVar35;
              auVar48._12_4_ = uVar35;
              auVar48._16_4_ = uVar35;
              auVar48._20_4_ = uVar35;
              auVar48._24_4_ = uVar35;
              auVar48._28_4_ = uVar35;
              auVar42._8_4_ = gap;
              auVar42._0_8_ = CONCAT44(0,gap);
              auVar42._12_4_ = 0;
              auVar42._16_4_ = gap;
              auVar42._20_4_ = 0;
              auVar42._24_4_ = gap;
              auVar42._28_4_ = 0;
              auVar47._8_8_ = uVar25;
              auVar47._0_8_ = uVar25;
              auVar47._16_8_ = uVar25;
              auVar47._24_8_ = uVar25;
              auVar55 = vpmuldq_avx2(auVar48,_DAT_00908b60);
              auVar51[1] = bVar36;
              auVar51[0] = bVar36;
              auVar51[2] = bVar36;
              auVar51[3] = bVar36;
              auVar51[4] = bVar36;
              auVar51[5] = bVar36;
              auVar51[6] = bVar36;
              auVar51[7] = bVar36;
              auVar51[8] = bVar36;
              auVar51[9] = bVar36;
              auVar51[10] = bVar36;
              auVar51[0xb] = bVar36;
              auVar51[0xc] = bVar36;
              auVar51[0xd] = bVar36;
              auVar51[0xe] = bVar36;
              auVar51[0xf] = bVar36;
              uVar16 = 0;
              auVar51 = vpslld_avx(auVar51,0x1f);
              auVar51 = vpsrad_avx(auVar51,0x1f);
              auVar48 = vpmovsxdq_avx2(auVar51);
              palVar23 = ptr;
              palVar26 = ptr_00;
              do {
                auVar54._8_8_ = uVar16;
                auVar54._0_8_ = uVar16;
                auVar54._16_8_ = uVar16;
                auVar54._24_8_ = uVar16;
                auVar54 = vpaddq_avx2(auVar54,auVar55);
                auVar57 = vpmuludq_avx2(auVar54,auVar42);
                auVar54 = vpsrlq_avx2(auVar54,0x20);
                auVar54 = vpmuludq_avx2(auVar54,auVar42);
                auVar54 = vpsllq_avx2(auVar54,0x20);
                auVar54 = vpaddq_avx2(auVar57,auVar54);
                auVar54 = vpsubq_avx2(auVar47,auVar54);
                alVar9 = (__m256i)vpandn_avx2(auVar48,auVar54);
                alVar10 = (__m256i)vpsubq_avx2((undefined1  [32])alVar9,auVar44);
                *palVar23 = alVar9;
                *palVar26 = alVar10;
                uVar16 = uVar16 + 1;
                palVar26 = palVar26 + 1;
                palVar23 = palVar23 + 1;
              } while (size != uVar16);
              *ptr_01 = 0;
              uVar16 = (ulong)(uint)s2Len;
              lVar24 = uVar16 - 1;
              auVar57._8_8_ = lVar24;
              auVar57._0_8_ = lVar24;
              auVar57._16_8_ = lVar24;
              auVar57._24_8_ = lVar24;
              auVar41._4_4_ = gap;
              auVar41._0_4_ = gap;
              auVar41._8_4_ = gap;
              auVar41._12_4_ = gap;
              auVar46._4_4_ = iVar31;
              auVar46._0_4_ = iVar31;
              auVar46._8_4_ = iVar31;
              auVar46._12_4_ = iVar31;
              auVar51 = vpmovsxbd_avx(ZEXT416(0x4030201));
              uVar17 = 0;
              auVar48 = vpmovsxbq_avx2(ZEXT416(0x3020100));
              auVar55._8_8_ = 0x8000000000000000;
              auVar55._0_8_ = 0x8000000000000000;
              auVar55._16_8_ = 0x8000000000000000;
              auVar55._24_8_ = 0x8000000000000000;
              auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
              auVar52 = vpcmpeqd_avx(auVar52,auVar52);
              auVar58._8_4_ = 4;
              auVar58._0_8_ = 0x400000004;
              auVar58._12_4_ = 4;
              do {
                if (s2_beg == 0) {
                  auVar8 = vpaddd_avx(auVar52,auVar51);
                  auVar8 = vpmulld_avx(auVar8,auVar41);
                  auVar8 = vpsubd_avx(auVar46,auVar8);
                  auVar42 = vpmovsxdq_avx2(auVar8);
                }
                else {
                  auVar42 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                auVar59._8_8_ = uVar17;
                auVar59._0_8_ = uVar17;
                auVar59._16_8_ = uVar17;
                auVar59._24_8_ = uVar17;
                auVar47 = vpor_avx2(auVar59,auVar48);
                auVar47 = vpcmpgtq_avx2(auVar47 ^ auVar55,auVar57 ^ auVar55);
                auVar42 = vpmaskmovq_avx2(auVar47 ^ auVar50,auVar42);
                *(undefined1 (*) [32])(ptr_01 + uVar17 + 1) = auVar42;
                uVar17 = uVar17 + 4;
                auVar51 = vpaddd_avx(auVar58,auVar51);
              } while ((s2Len + 3U & 0xfffffffc) != uVar17);
              lVar32 = size * uVar16;
              lVar24 = 0;
              auVar50._0_8_ = -(ulong)(iVar28 == 3);
              auVar50._8_8_ = -(ulong)(iVar28 == 2);
              auVar50._16_8_ = -(ulong)(iVar28 == 1);
              auVar50._24_8_ = -(ulong)(-iVar12 == -3);
              uVar17 = 0;
              auVar49 = ZEXT3264(auVar38);
              auVar40 = ZEXT3264(auVar38);
              auVar43 = ZEXT3264(auVar39);
              local_c4 = iVar1;
              do {
                palVar23 = ptr;
                ptr = palVar15;
                auVar52 = SUB3216(palVar23[uVar35 - 1],0);
                auVar56._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar37;
                auVar56._16_16_ = ZEXT116(0) * auVar38._16_16_ + ZEXT116(1) * auVar52;
                auVar48 = vpalignr_avx2((undefined1  [32])palVar23[uVar35 - 1],auVar56,8);
                iVar34 = ppVar5->mapper[(byte)s2[uVar17]];
                auVar48 = vpblendd_avx2(auVar48,ZEXT832((ulong)ptr_01[uVar17]),3);
                lVar18 = 0;
                auVar53 = ZEXT3264(auVar38);
                lVar30 = lVar24;
                do {
                  auVar55 = vpaddq_avx2(auVar48,*(undefined1 (*) [32])
                                                 ((long)pvVar4 + lVar18 + (long)iVar34 * size * 0x20
                                                 ));
                  auVar48 = *(undefined1 (*) [32])((long)*ptr_00 + lVar18);
                  auVar42 = vpcmpgtq_avx2(auVar55,auVar48);
                  auVar55 = vblendvpd_avx(auVar48,auVar55,auVar42);
                  auVar54 = auVar53._0_32_;
                  auVar42 = vpcmpgtq_avx2(auVar55,auVar54);
                  auVar55 = vblendvpd_avx(auVar54,auVar55,auVar42);
                  *(undefined1 (*) [32])((long)*ptr + lVar18) = auVar55;
                  auVar42 = vpcmpgtq_avx2(auVar40._0_32_,auVar55);
                  auVar42 = vblendvpd_avx(auVar55,auVar40._0_32_,auVar42);
                  auVar40 = ZEXT3264(auVar42);
                  auVar42 = vpcmpgtq_avx2(auVar55,auVar43._0_32_);
                  auVar42 = vblendvpd_avx(auVar55,auVar43._0_32_,auVar42);
                  auVar47 = vpcmpgtq_avx2(auVar48,auVar42);
                  auVar42 = vblendvpd_avx(auVar48,auVar42,auVar47);
                  auVar47 = vpcmpgtq_avx2(auVar54,auVar42);
                  auVar42 = vblendvpd_avx(auVar54,auVar42,auVar47);
                  auVar43 = ZEXT3264(auVar42);
                  piVar6 = ((ppVar14->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar30) = auVar55._0_4_;
                  *(int *)((long)piVar6 + lVar32 * 4 + lVar30) = auVar55._8_4_;
                  *(int *)((long)piVar6 + lVar32 * 8 + lVar30) = auVar55._16_4_;
                  uVar3 = vextractps_avx(auVar55._16_16_,2);
                  *(undefined4 *)((long)piVar6 + lVar32 * 0xc + lVar30) = uVar3;
                  auVar55 = vpsubq_avx2(auVar55,auVar44);
                  auVar42 = vpsubq_avx2(auVar48,auVar45);
                  auVar48 = vpcmpgtq_avx2(auVar42,auVar55);
                  auVar48 = vblendvpd_avx(auVar55,auVar42,auVar48);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar18) = auVar48;
                  auVar42 = vpsubq_avx2(auVar54,auVar45);
                  auVar48 = vpcmpgtq_avx2(auVar42,auVar55);
                  auVar48 = vblendvpd_avx(auVar55,auVar42,auVar48);
                  auVar53 = ZEXT3264(auVar48);
                  auVar48 = *(undefined1 (*) [32])((long)*palVar23 + lVar18);
                  lVar18 = lVar18 + 0x20;
                  lVar30 = lVar30 + uVar16 * 4;
                } while (size * 0x20 != lVar18);
                iVar34 = 0;
                do {
                  uVar19 = uVar25;
                  if (s2_beg == 0) {
                    uVar19 = ptr_01[uVar17 + 1] - uVar21;
                  }
                  auVar48 = vpermpd_avx2(auVar53._0_32_,0x90);
                  auVar48 = vblendpd_avx(auVar48,ZEXT832(uVar19),1);
                  auVar53 = ZEXT3264(auVar48);
                  lVar18 = 0;
                  lVar30 = lVar24;
                  do {
                    auVar48 = *(undefined1 (*) [32])((long)*ptr + lVar18);
                    auVar47 = auVar53._0_32_;
                    auVar55 = vpcmpgtq_avx2(auVar48,auVar47);
                    auVar48 = vblendvpd_avx(auVar47,auVar48,auVar55);
                    *(undefined1 (*) [32])((long)*ptr + lVar18) = auVar48;
                    auVar55 = vpcmpgtq_avx2(auVar48,auVar43._0_32_);
                    auVar55 = vblendvpd_avx(auVar48,auVar43._0_32_,auVar55);
                    auVar43 = ZEXT3264(auVar55);
                    auVar42 = vpcmpgtq_avx2(auVar40._0_32_,auVar48);
                    auVar42 = vblendvpd_avx(auVar48,auVar40._0_32_,auVar42);
                    auVar40 = ZEXT3264(auVar42);
                    piVar6 = ((ppVar14->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + lVar30) = auVar48._0_4_;
                    *(int *)((long)piVar6 + lVar32 * 4 + lVar30) = auVar48._8_4_;
                    *(int *)((long)piVar6 + lVar32 * 8 + lVar30) = auVar48._16_4_;
                    *(int *)((long)piVar6 + lVar32 * 0xc + lVar30) = auVar48._24_4_;
                    auVar48 = vpsubq_avx2(auVar48,auVar44);
                    auVar47 = vpsubq_avx2(auVar47,auVar45);
                    auVar53 = ZEXT3264(auVar47);
                    auVar48 = vpcmpgtq_avx2(auVar47,auVar48);
                    if ((((auVar48 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar48 >> 0x7f,0) == '\0') && SUB321(auVar48 >> 0xbf,0) == '\0') &&
                        -1 < auVar48[0x1f]) goto LAB_007bfbdd;
                    lVar18 = lVar18 + 0x20;
                    lVar30 = lVar30 + uVar16 * 4;
                  } while (size * 0x20 != lVar18);
                  iVar34 = iVar34 + 1;
                } while (iVar34 != 4);
LAB_007bfbdd:
                auVar47 = vpcmpgtq_avx2((undefined1  [32])ptr[uVar7],auVar49._0_32_);
                auVar48 = vblendvpd_avx(auVar49._0_32_,(undefined1  [32])ptr[uVar7],auVar47);
                auVar52 = auVar48._16_16_;
                auVar49 = ZEXT3264(auVar48);
                auVar47 = auVar50 & auVar47;
                if ((((auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar47 >> 0x7f,0) != '\0') || SUB321(auVar47 >> 0xbf,0) != '\0') ||
                    auVar47[0x1f] < '\0') {
                  local_c4 = (int)uVar17;
                }
                uVar17 = uVar17 + 1;
                lVar24 = lVar24 + 4;
                palVar15 = palVar23;
                if (uVar17 == uVar16) {
                  if (s2_end != 0) {
                    if (iVar12 < 3) {
                      iVar34 = 0;
                      do {
                        auVar48 = auVar49._0_32_;
                        auVar50 = vperm2i128_avx2(auVar48,auVar48,8);
                        auVar50 = vpalignr_avx2(auVar48,auVar50,8);
                        auVar52 = auVar50._16_16_;
                        auVar49 = ZEXT3264(auVar50);
                        iVar34 = iVar34 + 1;
                      } while (iVar34 < iVar28);
                    }
                    lVar22 = vpextrq_avx(auVar52,1);
                  }
                  uVar20 = uVar27;
                  if ((s1_end != 0) && ((uVar29 & 0x7ffffffc) != 0)) {
                    uVar29 = 0;
                    lVar24 = lVar22;
                    do {
                      uVar13 = ((uint)uVar29 & 3) * uVar35 + ((uint)(uVar29 >> 2) & 0x3fffffff);
                      lVar22 = lVar24;
                      uVar11 = uVar20;
                      iVar34 = local_c4;
                      if (((int)uVar13 < (int)uVar2) &&
                         (lVar22 = (*ptr)[uVar29], uVar11 = uVar13, iVar34 = iVar1, lVar22 <= lVar24
                         )) {
                        if ((int)uVar20 <= (int)uVar13) {
                          uVar13 = uVar20;
                        }
                        if (local_c4 != iVar1) {
                          uVar13 = uVar20;
                        }
                        bVar36 = lVar22 == lVar24;
                        lVar22 = lVar24;
                        uVar11 = uVar20;
                        iVar34 = local_c4;
                        if (bVar36) {
                          uVar11 = uVar13;
                        }
                      }
                      local_c4 = iVar34;
                      uVar20 = uVar11;
                      uVar29 = uVar29 + 1;
                      lVar24 = lVar22;
                    } while ((uVar35 & 0x1fffffff) << 2 != (int)uVar29);
                  }
                  iVar34 = (int)lVar22;
                  if (s2_end == 0 && s1_end == 0) {
                    alVar9 = ptr[uVar7];
                    auVar52 = alVar9._16_16_;
                    if (iVar12 < 3) {
                      iVar34 = 0;
                      do {
                        auVar50 = vperm2i128_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar9,
                                                  8);
                        alVar9 = (__m256i)vpalignr_avx2((undefined1  [32])alVar9,auVar50,8);
                        auVar52 = alVar9._16_16_;
                        iVar34 = iVar34 + 1;
                      } while (iVar34 < iVar28);
                    }
                    uVar33 = vpextrq_avx(auVar52,1);
                    iVar34 = (int)uVar33;
                    uVar20 = uVar27;
                    local_c4 = iVar1;
                  }
                  auVar50 = vpcmpgtq_avx2(auVar38,auVar55);
                  auVar48 = vpcmpgtq_avx2(auVar42,auVar39);
                  auVar50 = vpor_avx2(auVar48,auVar50);
                  if ((((auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar50 >> 0x7f,0) != '\0') || SUB321(auVar50 >> 0xbf,0) != '\0') ||
                      auVar50[0x1f] < '\0') {
                    *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                    iVar34 = 0;
                    local_c4 = 0;
                    uVar20 = 0;
                  }
                  ppVar14->score = iVar34;
                  ppVar14->end_query = uVar20;
                  ppVar14->end_ref = local_c4;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar23);
                  parasail_free(ptr);
                  return ppVar14;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}